

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void DoFilter2_SSE2(__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,int thresh)

{
  __m128i alVar1;
  uint uVar2;
  uint uVar3;
  longlong lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i mask;
  __m128i local_38;
  __m128i local_28;
  
  auVar6 = psubsb((undefined1  [16])*p1 ^ _DAT_0013fb80,(undefined1  [16])*q1 ^ _DAT_0013fb80);
  NeedsFilter_SSE2(p1,p0,q0,q1,thresh,&local_38);
  auVar5 = _DAT_0013fb80;
  *p0 = (__m128i)((undefined1  [16])*p0 ^ _DAT_0013fb80);
  alVar1 = *q0;
  *q0 = (__m128i)((undefined1  [16])alVar1 ^ auVar5);
  auVar5 = psubsb((undefined1  [16])alVar1 ^ auVar5,(undefined1  [16])*p0);
  auVar6 = paddsb(auVar6,auVar5);
  auVar6 = paddsb(auVar6,auVar5);
  auVar5 = paddsb(auVar6,auVar5);
  local_28 = (__m128i)(auVar5 & (undefined1  [16])local_38);
  DoSimpleFilter_SSE2(p0,q0,&local_28);
  uVar2 = *(uint *)((long)*p0 + 4);
  lVar4 = (*p0)[1];
  uVar3 = *(uint *)((long)*p0 + 0xc);
  *(uint *)*p0 = (uint)(*p0)[0] ^ 0x80808080;
  *(uint *)((long)*p0 + 4) = uVar2 ^ 0x80808080;
  *(uint *)(*p0 + 1) = (uint)lVar4 ^ 0x80808080;
  *(uint *)((long)*p0 + 0xc) = uVar3 ^ 0x80808080;
  uVar2 = *(uint *)((long)*q0 + 4);
  lVar4 = (*q0)[1];
  uVar3 = *(uint *)((long)*q0 + 0xc);
  *(uint *)*q0 = (uint)(*q0)[0] ^ 0x80808080;
  *(uint *)((long)*q0 + 4) = uVar2 ^ 0x80808080;
  *(uint *)(*q0 + 1) = (uint)lVar4 ^ 0x80808080;
  *(uint *)((long)*q0 + 0xc) = uVar3 ^ 0x80808080;
  return;
}

Assistant:

static WEBP_INLINE void DoFilter2_SSE2(__m128i* const p1, __m128i* const p0,
                                       __m128i* const q0, __m128i* const q1,
                                       int thresh) {
  __m128i a, mask;
  const __m128i sign_bit = _mm_set1_epi8((char)0x80);
  // convert p1/q1 to int8_t (for GetBaseDelta_SSE2)
  const __m128i p1s = _mm_xor_si128(*p1, sign_bit);
  const __m128i q1s = _mm_xor_si128(*q1, sign_bit);

  NeedsFilter_SSE2(p1, p0, q0, q1, thresh, &mask);

  FLIP_SIGN_BIT2(*p0, *q0);
  GetBaseDelta_SSE2(&p1s, p0, q0, &q1s, &a);
  a = _mm_and_si128(a, mask);     // mask filter values we don't care about
  DoSimpleFilter_SSE2(p0, q0, &a);
  FLIP_SIGN_BIT2(*p0, *q0);
}